

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O1

char * zt_opt_verror_str(int code,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  char *user_message;
  char *msg;
  char *final;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_28 = (char *)0x0;
  local_30 = (char *)0x0;
  local_20 = (char *)0x0;
  if (code == 0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = strerror(code);
  }
  asprintf(&local_28,"error: { code: %d, string: \"%s",code,pcVar1);
  if (fmt != (char *)0x0) {
    vasprintf(&local_30,fmt,ap);
  }
  asprintf(&local_20,"%s: %s\" }",local_28,local_30);
  if (local_30 != (char *)0x0) {
    free(local_30);
    local_30 = (char *)0x0;
  }
  if (local_28 != (char *)0x0) {
    free(local_28);
  }
  return local_20;
}

Assistant:

char *
zt_opt_verror_str(int code, char * fmt, va_list ap) {
    char * msg          = NULL;
    char * user_message = NULL;
    char * final        = NULL;
    int    len          = 0;

    len = asprintf(&msg, "error: { code: %d, string: \"%s", code, code ? strerror(code) : "");
    if (fmt) {
        len += vasprintf(&user_message, fmt, ap);
    }
    len += asprintf(&final, "%s: %s\" }", msg, user_message);

    zt_free(user_message);
    zt_free(msg);
    return final;
}